

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O1

bool __thiscall ui::Renderable::hovers(Renderable *this,Point p)

{
  Point PVar1;
  Point PVar2;
  Renderable *pRVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  if (this->_hoverable != false) {
    PVar1 = (this->super_Area)._origin;
    PVar2 = (this->super_Area)._padding;
    fVar6 = PVar2.x;
    fVar4 = (p.x - PVar1.x) - fVar6;
    fVar7 = PVar2.y;
    fVar5 = (p.y - PVar1.y) - fVar7;
    pRVar3 = this->_root;
    if (pRVar3 != this) {
      fVar4 = fVar4 - (pRVar3->super_Area)._origin.x;
      fVar5 = fVar5 - (pRVar3->super_Area)._origin.y;
    }
    if ((((0.0 <= fVar4) && (0.0 <= fVar5)) &&
        (PVar1 = (this->super_Area)._dimension, fVar4 <= PVar1.x - fVar6)) &&
       (fVar5 <= PVar1.y - fVar7)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool hovers(Point p) {
            if(_hoverable == false) return false;
            Point t = p - origin() - padding();
            if(_root != this) t -= _root->origin();
            if(t >= Point {0, 0} && t <= dimension() - padding()) {
                return true;
            }
            return false;
        }